

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_book_graphics(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s;
  wchar_t *pwVar4;
  object_kind *poVar5;
  size_t sVar6;
  object_kind *k;
  class_book *b;
  char *color;
  wchar_t glyph;
  player_class *c;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  wVar1 = parser_getchar(p,"glyph");
  __s = parser_getsym(p,"color");
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar3 + 0xf8) < 1) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if ((*(long *)((long)pvVar3 + 0x100) == 0) ||
       (class_max_books < *(wchar_t *)((long)pvVar3 + 0xf8))) {
      __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                    ,0xe9d,"enum parser_error parse_class_book_graphics(struct parser *)");
    }
    pwVar4 = (wchar_t *)
             (*(long *)((long)pvVar3 + 0x100) + (long)(*(int *)((long)pvVar3 + 0xf8) + -1) * 0x20);
    poVar5 = lookup_kind(*pwVar4,pwVar4[1]);
    if (poVar5 == (object_kind *)0x0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                    ,0xea0,"enum parser_error parse_class_book_graphics(struct parser *)");
    }
    poVar5->d_char = wVar1;
    sVar6 = strlen(__s);
    if (sVar6 < 2) {
      iVar2 = color_char_to_attr(*__s);
      poVar5->d_attr = (uint8_t)iVar2;
    }
    else {
      iVar2 = color_text_to_attr(__s);
      poVar5->d_attr = (uint8_t)iVar2;
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_book_graphics(struct parser *p) {
	struct player_class *c = parser_priv(p);
	wchar_t glyph = parser_getchar(p, "glyph");
	const char *color = parser_getsym(p, "color");
	struct class_book *b;
	struct object_kind *k;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	b = &c->magic.books[c->magic.num_books - 1];
	k = lookup_kind(b->tval, b->sval);
	assert(k);
	k->d_char = glyph;
	if (strlen(color) > 1) {
		k->d_attr = color_text_to_attr(color);
	} else {
		k->d_attr = color_char_to_attr(color[0]);
	}

	return PARSE_ERROR_NONE;
}